

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeConvolution(ConvertLayerParameters layerParameters)

{
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<float> *pRVar2;
  Rep *pRVar3;
  string *psVar4;
  string *psVar5;
  void *pvVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  Type *pTVar11;
  Type *pTVar12;
  Type *this;
  ConvolutionLayerParams *pCVar13;
  LogMessage *pLVar14;
  undefined8 *puVar15;
  long *plVar16;
  ValidPadding *pVVar17;
  BorderAmounts *pBVar18;
  Type *pTVar19;
  WeightParams *pWVar20;
  uint uVar21;
  int **ppiVar22;
  size_type *psVar23;
  ulong uVar24;
  ulong *puVar25;
  long *plVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ConvolutionParameter *from;
  ulong uVar30;
  uint64 uVar31;
  char *pcVar32;
  ulong uVar33;
  char cVar34;
  char **ppcVar35;
  long lVar36;
  Arena *pAVar37;
  void **ppvVar38;
  uint uVar39;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str_5;
  string __str;
  string __str_11;
  string __str_10;
  string __str_1;
  string __str_13;
  string __str_4;
  string __str_3;
  ConvolutionParameter caffeLayerParams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  undefined1 local_6e8 [56];
  Type *local_6b0;
  uint64 local_6a8;
  Type *local_6a0;
  undefined1 local_698 [56];
  uint64 local_660;
  uint64 local_658;
  ulong *local_650;
  long local_648;
  ulong local_640;
  undefined8 uStack_638;
  uint64 local_630;
  ulong local_628;
  undefined1 local_620 [16];
  char *local_610;
  _Alloc_hider _Stack_608;
  undefined1 local_5e8 [16];
  char *local_5d8;
  _Alloc_hider _Stack_5d0;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0;
  long lStack_598;
  undefined1 local_590 [16];
  int *local_580;
  _Alloc_hider _Stack_578;
  ulong *local_558;
  uint local_550;
  undefined4 uStack_54c;
  ulong local_548 [2];
  long *local_538;
  long local_530;
  long local_528;
  long lStack_520;
  undefined1 local_518 [16];
  char *local_508;
  _Alloc_hider _Stack_500;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  undefined1 local_4c0 [16];
  char *local_4b0 [5];
  undefined1 local_488 [56];
  undefined1 local_450 [32];
  Rep *local_430;
  uint local_428;
  Rep *local_420;
  uint local_418;
  Rep *local_410;
  uint local_408;
  Rep *local_400;
  uint local_3e8;
  uint local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint32 local_3d0;
  uint local_3c4;
  bool local_3c0;
  uint local_3bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  LogMessage local_378;
  LogMessage local_340;
  undefined1 local_308 [16];
  char *local_2f8 [5];
  LogMessage local_2d0;
  LogMessage local_298;
  LogMessage local_260;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar9 = getLayerIndex(pTVar11,in_stack_00000030);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar9);
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (in_stack_00000018,(Type *)0x0);
  if (((pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar11->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_450._0_8_ = local_450 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_450,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_450,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
    if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
      operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
    }
  }
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar3 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar29 = (long)(pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_6b0 = pTVar12;
  local_6a0 = pTVar11;
  if (lVar29 != 0) {
    lVar36 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_398,*(value_type **)((long)ppvVar38 + lVar36));
      lVar36 = lVar36 + 8;
    } while (lVar29 * 8 != lVar36);
  }
  pRVar3 = (local_6a0->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar29 = (long)(local_6a0->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar29 != 0) {
    lVar36 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_3b8,*(value_type **)((long)ppvVar38 + lVar36));
      lVar36 = lVar36 + 8;
    } while (lVar29 * 8 != lVar36);
  }
  pTVar12 = local_6a0;
  convertCaffeMetadata
            ((local_6a0->name_).ptr_,&local_398,&local_3b8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pTVar11 = local_6b0;
  from = pTVar12->convolution_param_;
  if (from == (ConvolutionParameter *)0x0) {
    from = (ConvolutionParameter *)&caffe::_ConvolutionParameter_default_instance_;
  }
  caffe::ConvolutionParameter::ConvolutionParameter((ConvolutionParameter *)local_450,from);
  if (this->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 100;
    pCVar13 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar13);
    (this->layer_).convolution_ = pCVar13;
  }
  pCVar13 = (this->layer_).convolution_;
  local_6a8 = (uint64)local_3e8;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"Weight blobs not provided","");
    errorInCaffeProto((string *)local_6e8,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  local_658 = (uint64)local_3bc;
  if (local_658 == 0) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"group parameter cannot be 0","");
    errorInCaffeProto((string *)local_6e8,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ - 1U < 2) {
    if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_260);
    }
    pTVar11 = local_6b0;
    puVar15 = *(undefined8 **)
               ((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar15 + 3) == 0) {
      if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_378,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_378,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_378);
      }
      local_660 = (uint64)*(int *)((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->
                                         elements[0] + 0x80);
      if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_340,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_340,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_340);
      }
      local_630 = (uint64)*(int *)((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->
                                         elements[0] + 0x84);
      pTVar11 = local_6b0;
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)(pTVar12->type_).ptr_);
      iVar9 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_;
      if (iVar10 == 0) {
        if (iVar9 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_2d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_2d0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
        }
        puVar15 = *(undefined8 **)
                   ((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
        ;
        if (puVar15 == (undefined8 *)0x0) {
          puVar15 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar15 + 3) < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_298,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_298,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_298);
        }
        local_660 = *(uint64 *)(puVar15[4] + 0x10);
        if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_378,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_378,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_378);
        }
        puVar15 = *(undefined8 **)
                   ((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
        ;
        if (puVar15 == (undefined8 *)0x0) {
          puVar15 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar15 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_340,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_340,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_340);
        }
        local_630 = *(uint64 *)(puVar15[4] + 8);
        pTVar11 = local_6b0;
      }
      else {
        if (iVar9 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_2d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_2d0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
        }
        puVar15 = *(undefined8 **)
                   ((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
        ;
        if (puVar15 == (undefined8 *)0x0) {
          puVar15 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar15 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_298,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_298,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_298);
        }
        local_660 = *(uint64 *)(puVar15[4] + 8);
        if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_378,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_378,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_378);
        }
        puVar15 = *(undefined8 **)
                   ((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
        ;
        if (puVar15 == (undefined8 *)0x0) {
          puVar15 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar15 + 3) < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_340,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_340,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_340);
        }
        local_630 = *(uint64 *)(puVar15[4] + 0x10);
        pTVar11 = local_6b0;
      }
    }
  }
  else {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"Number of blobs must be 2 or 1 (when there is no bias)","");
    errorInCaffeProto((string *)local_6e8,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
    local_630 = 0;
    local_660 = 0;
  }
  local_628 = 0;
  if (1 < (pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_228,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_228,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_228);
    }
    local_628 = (ulong)*(uint *)(*(long *)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_ + 1)
                                + 0x18);
  }
  iVar9 = std::__cxx11::string::compare((char *)(pTVar12->type_).ptr_);
  if (iVar9 == 0) {
    if (local_660 * local_658 - local_6a8 != 0) {
      cVar34 = '\x01';
      if (9 < (uint)local_6a8) {
        uVar31 = local_6a8;
        cVar8 = '\x04';
        do {
          cVar34 = cVar8;
          uVar27 = (uint)uVar31;
          if (uVar27 < 100) {
            cVar34 = cVar34 + -2;
            goto LAB_003fb72e;
          }
          if (uVar27 < 1000) {
            cVar34 = cVar34 + -1;
            goto LAB_003fb72e;
          }
          if (uVar27 < 10000) goto LAB_003fb72e;
          uVar31 = (uVar31 & 0xffffffff) / 10000;
          cVar8 = cVar34 + '\x04';
        } while (99999 < uVar27);
        cVar34 = cVar34 + '\x01';
      }
LAB_003fb72e:
      local_308._0_8_ = local_2f8;
      std::__cxx11::string::_M_construct((ulong)local_308,cVar34);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_308._0_8_,local_308._8_4_,(uint)local_6a8);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)local_308,0,(char *)0x0,0x5feff8);
      local_5e8._0_8_ = &local_5d8;
      ppcVar35 = (char **)(plVar16 + 2);
      if ((char **)*plVar16 == ppcVar35) {
        local_5d8 = *ppcVar35;
        _Stack_5d0._M_p = (pointer)plVar16[3];
      }
      else {
        local_5d8 = *ppcVar35;
        local_5e8._0_8_ = (char **)*plVar16;
      }
      local_5e8._8_8_ = plVar16[1];
      *plVar16 = (long)ppcVar35;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_5e8);
      ppcVar35 = (char **)(plVar16 + 2);
      if ((char **)*plVar16 == ppcVar35) {
        local_508 = *ppcVar35;
        _Stack_500._M_p = (pointer)plVar16[3];
        local_518._0_8_ = &local_508;
      }
      else {
        local_508 = *ppcVar35;
        local_518._0_8_ = (char **)*plVar16;
      }
      local_518._8_8_ = plVar16[1];
      *plVar16 = (long)ppcVar35;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      cVar34 = '\x01';
      if (9 < (uint)local_658) {
        uVar31 = local_658;
        cVar8 = '\x04';
        do {
          cVar34 = cVar8;
          uVar27 = (uint)uVar31;
          if (uVar27 < 100) {
            cVar34 = cVar34 + -2;
            goto LAB_003fb889;
          }
          if (uVar27 < 1000) {
            cVar34 = cVar34 + -1;
            goto LAB_003fb889;
          }
          if (uVar27 < 10000) goto LAB_003fb889;
          uVar31 = (uVar31 & 0xffffffff) / 10000;
          cVar8 = cVar34 + '\x04';
        } while (99999 < uVar27);
        cVar34 = cVar34 + '\x01';
      }
LAB_003fb889:
      local_488._0_8_ = local_488 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_488,cVar34);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_488._0_8_,local_488._8_4_,(uint)local_658);
      pcVar32 = (char *)0xf;
      if ((char **)local_518._0_8_ != &local_508) {
        pcVar32 = local_508;
      }
      if (pcVar32 < (char *)(local_518._8_8_ + CONCAT44(local_488._12_4_,local_488._8_4_))) {
        pcVar32 = (char *)0xf;
        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
          pcVar32 = (char *)local_488._16_8_;
        }
        if (pcVar32 < (char *)(local_518._8_8_ + CONCAT44(local_488._12_4_,local_488._8_4_)))
        goto LAB_003fb911;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_488,0,(char *)0x0,local_518._0_8_);
      }
      else {
LAB_003fb911:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_518,local_488._0_8_);
      }
      local_590._0_8_ = &local_580;
      ppiVar22 = (int **)(puVar15 + 2);
      if ((int **)*puVar15 == ppiVar22) {
        local_580 = *ppiVar22;
        _Stack_578._M_p = (pointer)puVar15[3];
      }
      else {
        local_580 = *ppiVar22;
        local_590._0_8_ = (int **)*puVar15;
      }
      local_590._8_8_ = puVar15[1];
      *puVar15 = ppiVar22;
      puVar15[1] = 0;
      *(undefined1 *)ppiVar22 = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_590);
      ppcVar35 = (char **)(plVar16 + 2);
      if ((char **)*plVar16 == ppcVar35) {
        local_610 = *ppcVar35;
        _Stack_608._M_p = (pointer)plVar16[3];
        local_620._0_8_ = &local_610;
      }
      else {
        local_610 = *ppcVar35;
        local_620._0_8_ = (char **)*plVar16;
      }
      local_620._8_8_ = plVar16[1];
      *plVar16 = (long)ppcVar35;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      uVar30 = -local_660;
      if (0 < (long)local_660) {
        uVar30 = local_660;
      }
      uVar27 = 1;
      if (9 < uVar30) {
        uVar24 = uVar30;
        uVar28 = 4;
        do {
          uVar27 = uVar28;
          if (uVar24 < 100) {
            uVar27 = uVar27 - 2;
            goto LAB_003fba63;
          }
          if (uVar24 < 1000) {
            uVar27 = uVar27 - 1;
            goto LAB_003fba63;
          }
          if (uVar24 < 10000) goto LAB_003fba63;
          bVar7 = 99999 < uVar24;
          uVar24 = uVar24 / 10000;
          uVar28 = uVar27 + 4;
        } while (bVar7);
        uVar27 = uVar27 + 1;
      }
LAB_003fba63:
      lVar29 = (long)local_660 >> 0x3f;
      local_4c0._0_8_ = local_4b0;
      std::__cxx11::string::_M_construct
                ((ulong)local_4c0,(char)uVar27 - (char)((long)local_660 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_4c0._0_8_ - lVar29),uVar27,uVar30);
      pcVar32 = (char *)0xf;
      if ((char **)local_620._0_8_ != &local_610) {
        pcVar32 = local_610;
      }
      if (pcVar32 < (char *)(local_4c0._8_8_ + local_620._8_8_)) {
        pcVar32 = (char *)0xf;
        if ((char **)local_4c0._0_8_ != local_4b0) {
          pcVar32 = local_4b0[0];
        }
        if (pcVar32 < (char *)(local_4c0._8_8_ + local_620._8_8_)) goto LAB_003fbafd;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_4c0,0,(char *)0x0,local_620._0_8_);
      }
      else {
LAB_003fbafd:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_620,local_4c0._0_8_);
      }
      local_698._0_8_ = local_698 + 0x10;
      psVar23 = puVar15 + 2;
      if ((size_type *)*puVar15 == psVar23) {
        local_698._16_8_ = *psVar23;
        local_698._24_8_ = puVar15[3];
      }
      else {
        local_698._16_8_ = *psVar23;
        local_698._0_8_ = (size_type *)*puVar15;
      }
      local_698._8_8_ = puVar15[1];
      *puVar15 = psVar23;
      puVar15[1] = 0;
      *(undefined1 *)psVar23 = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_698);
      psVar23 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar23) {
        local_6e8._16_8_ = *psVar23;
        local_6e8._24_8_ = plVar16[3];
        local_6e8._0_8_ = local_6e8 + 0x10;
      }
      else {
        local_6e8._16_8_ = *psVar23;
        local_6e8._0_8_ = (size_type *)*plVar16;
      }
      local_6e8._8_8_ = plVar16[1];
      *plVar16 = (long)psVar23;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      errorInCaffeProto((string *)local_6e8,(local_6a0->name_).ptr_,(local_6a0->type_).ptr_);
      if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
        operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
      }
      if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
        operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
      }
      if ((char **)local_4c0._0_8_ != local_4b0) {
        operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0[0] + 1));
      }
      pTVar12 = local_6a0;
      if ((char **)local_620._0_8_ != &local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610 + 1));
      }
      if ((int **)local_590._0_8_ != &local_580) {
        operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
      }
      if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
        operator_delete((void *)local_488._0_8_,(ulong)(local_488._16_8_ + 1));
      }
      if ((char **)local_518._0_8_ != &local_508) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508 + 1));
      }
      if ((char **)local_5e8._0_8_ != &local_5d8) {
        operator_delete((void *)local_5e8._0_8_,(ulong)(local_5d8 + 1));
      }
      ppcVar35 = (char **)local_308._0_8_;
      if ((char **)local_308._0_8_ != local_2f8) goto LAB_003fbcf5;
    }
  }
  else {
    if (local_660 != local_6a8) {
      cVar34 = '\x01';
      if (9 < (uint)local_6a8) {
        uVar30 = local_6a8;
        cVar8 = '\x04';
        do {
          cVar34 = cVar8;
          uVar27 = (uint)uVar30;
          if (uVar27 < 100) {
            cVar34 = cVar34 + -2;
            goto LAB_003fafb6;
          }
          if (uVar27 < 1000) {
            cVar34 = cVar34 + -1;
            goto LAB_003fafb6;
          }
          if (uVar27 < 10000) goto LAB_003fafb6;
          uVar30 = (uVar30 & 0xffffffff) / 10000;
          cVar8 = cVar34 + '\x04';
        } while (99999 < uVar27);
        cVar34 = cVar34 + '\x01';
      }
LAB_003fafb6:
      local_518._0_8_ = &local_508;
      std::__cxx11::string::_M_construct((ulong)local_518,cVar34);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_518._0_8_,local_518._8_4_,(uint)local_6a8);
      puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_518,0,(char *)0x0,0x5feff8)
      ;
      local_590._0_8_ = &local_580;
      ppiVar22 = (int **)(puVar15 + 2);
      if ((int **)*puVar15 == ppiVar22) {
        local_580 = *ppiVar22;
        _Stack_578._M_p = (pointer)puVar15[3];
      }
      else {
        local_580 = *ppiVar22;
        local_590._0_8_ = (int **)*puVar15;
      }
      local_590._8_8_ = puVar15[1];
      *puVar15 = ppiVar22;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_590);
      ppcVar35 = (char **)(plVar16 + 2);
      if ((char **)*plVar16 == ppcVar35) {
        local_610 = *ppcVar35;
        _Stack_608._M_p = (pointer)plVar16[3];
        local_620._0_8_ = &local_610;
      }
      else {
        local_610 = *ppcVar35;
        local_620._0_8_ = (char **)*plVar16;
      }
      local_620._8_8_ = plVar16[1];
      *plVar16 = (long)ppcVar35;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      uVar30 = -local_660;
      if (0 < (long)local_660) {
        uVar30 = local_660;
      }
      uVar27 = 1;
      if (9 < uVar30) {
        uVar24 = uVar30;
        uVar28 = 4;
        do {
          uVar27 = uVar28;
          if (uVar24 < 100) {
            uVar27 = uVar27 - 2;
            goto LAB_003fb123;
          }
          if (uVar24 < 1000) {
            uVar27 = uVar27 - 1;
            goto LAB_003fb123;
          }
          if (uVar24 < 10000) goto LAB_003fb123;
          bVar7 = 99999 < uVar24;
          uVar24 = uVar24 / 10000;
          uVar28 = uVar27 + 4;
        } while (bVar7);
        uVar27 = uVar27 + 1;
      }
LAB_003fb123:
      lVar29 = (long)local_660 >> 0x3f;
      local_5e8._0_8_ = &local_5d8;
      std::__cxx11::string::_M_construct
                ((ulong)local_5e8,(char)uVar27 - (char)((long)local_660 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_5e8._0_8_ - lVar29),uVar27,uVar30);
      pcVar32 = (char *)0xf;
      if ((char **)local_620._0_8_ != &local_610) {
        pcVar32 = local_610;
      }
      if (pcVar32 < (char *)(local_5e8._8_8_ + local_620._8_8_)) {
        pcVar32 = (char *)0xf;
        if ((char **)local_5e8._0_8_ != &local_5d8) {
          pcVar32 = local_5d8;
        }
        if (pcVar32 < (char *)(local_5e8._8_8_ + local_620._8_8_)) goto LAB_003fb1b6;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_5e8,0,(char *)0x0,local_620._0_8_);
      }
      else {
LAB_003fb1b6:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_620,local_5e8._0_8_);
      }
      local_698._0_8_ = local_698 + 0x10;
      psVar23 = puVar15 + 2;
      if ((size_type *)*puVar15 == psVar23) {
        local_698._16_8_ = *psVar23;
        local_698._24_8_ = puVar15[3];
      }
      else {
        local_698._16_8_ = *psVar23;
        local_698._0_8_ = (size_type *)*puVar15;
      }
      local_698._8_8_ = puVar15[1];
      *puVar15 = psVar23;
      puVar15[1] = 0;
      *(undefined1 *)psVar23 = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_698);
      psVar23 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar23) {
        local_6e8._16_8_ = *psVar23;
        local_6e8._24_8_ = plVar16[3];
        local_6e8._0_8_ = local_6e8 + 0x10;
      }
      else {
        local_6e8._16_8_ = *psVar23;
        local_6e8._0_8_ = (size_type *)*plVar16;
      }
      local_6e8._8_8_ = plVar16[1];
      *plVar16 = (long)psVar23;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      errorInCaffeProto((string *)local_6e8,(local_6a0->name_).ptr_,(local_6a0->type_).ptr_);
      if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
        operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
      }
      if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
        operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
      }
      if ((char **)local_5e8._0_8_ != &local_5d8) {
        operator_delete((void *)local_5e8._0_8_,(ulong)(local_5d8 + 1));
      }
      pTVar12 = local_6a0;
      if ((char **)local_620._0_8_ != &local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610 + 1));
      }
      if ((int **)local_590._0_8_ != &local_580) {
        operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
      }
      if ((char **)local_518._0_8_ != &local_508) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508 + 1));
      }
    }
    if ((int)((local_6a8 & 0xffffffff) % (local_658 & 0xffffffff)) == 0) goto LAB_003fbcfd;
    cVar34 = '\x01';
    if (9 < (uint)local_6a8) {
      uVar31 = local_6a8;
      cVar8 = '\x04';
      do {
        cVar34 = cVar8;
        uVar27 = (uint)uVar31;
        if (uVar27 < 100) {
          cVar34 = cVar34 + -2;
          goto LAB_003fb3b4;
        }
        if (uVar27 < 1000) {
          cVar34 = cVar34 + -1;
          goto LAB_003fb3b4;
        }
        if (uVar27 < 10000) goto LAB_003fb3b4;
        uVar31 = (uVar31 & 0xffffffff) / 10000;
        cVar8 = cVar34 + '\x04';
      } while (99999 < uVar27);
      cVar34 = cVar34 + '\x01';
    }
LAB_003fb3b4:
    local_518._0_8_ = &local_508;
    std::__cxx11::string::_M_construct((ulong)local_518,cVar34);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_518._0_8_,local_518._8_4_,(uint)local_6a8);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_518,0,(char *)0x0,0x5feff8);
    ppiVar22 = (int **)(puVar15 + 2);
    if ((int **)*puVar15 == ppiVar22) {
      local_580 = *ppiVar22;
      _Stack_578._M_p = (pointer)puVar15[3];
      local_590._0_8_ = &local_580;
    }
    else {
      local_580 = *ppiVar22;
      local_590._0_8_ = (int **)*puVar15;
    }
    local_590._8_8_ = puVar15[1];
    *puVar15 = ppiVar22;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_590);
    ppcVar35 = (char **)(plVar16 + 2);
    if ((char **)*plVar16 == ppcVar35) {
      local_610 = *ppcVar35;
      _Stack_608._M_p = (pointer)plVar16[3];
      local_620._0_8_ = &local_610;
    }
    else {
      local_610 = *ppcVar35;
      local_620._0_8_ = (char **)*plVar16;
    }
    local_620._8_8_ = plVar16[1];
    *plVar16 = (long)ppcVar35;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    cVar34 = '\x01';
    if (9 < (uint)local_658) {
      uVar31 = local_658;
      cVar8 = '\x04';
      do {
        cVar34 = cVar8;
        uVar27 = (uint)uVar31;
        if (uVar27 < 100) {
          cVar34 = cVar34 + -2;
          goto LAB_003fb511;
        }
        if (uVar27 < 1000) {
          cVar34 = cVar34 + -1;
          goto LAB_003fb511;
        }
        if (uVar27 < 10000) goto LAB_003fb511;
        uVar31 = (uVar31 & 0xffffffff) / 10000;
        cVar8 = cVar34 + '\x04';
      } while (99999 < uVar27);
      cVar34 = cVar34 + '\x01';
    }
LAB_003fb511:
    local_5e8._0_8_ = &local_5d8;
    std::__cxx11::string::_M_construct((ulong)local_5e8,cVar34);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_5e8._0_8_,local_5e8._8_4_,(uint)local_658);
    pcVar32 = (char *)0xf;
    if ((char **)local_620._0_8_ != &local_610) {
      pcVar32 = local_610;
    }
    if (pcVar32 < (char *)(local_5e8._8_8_ + local_620._8_8_)) {
      pcVar32 = (char *)0xf;
      if ((char **)local_5e8._0_8_ != &local_5d8) {
        pcVar32 = local_5d8;
      }
      if (pcVar32 < (char *)(local_5e8._8_8_ + local_620._8_8_)) goto LAB_003fb599;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_5e8,0,(char *)0x0,local_620._0_8_);
    }
    else {
LAB_003fb599:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_620,local_5e8._0_8_);
    }
    local_698._0_8_ = local_698 + 0x10;
    psVar23 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar23) {
      local_698._16_8_ = *psVar23;
      local_698._24_8_ = puVar15[3];
    }
    else {
      local_698._16_8_ = *psVar23;
      local_698._0_8_ = (size_type *)*puVar15;
    }
    local_698._8_8_ = puVar15[1];
    *puVar15 = psVar23;
    puVar15[1] = 0;
    *(undefined1 *)psVar23 = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_698);
    psVar23 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar23) {
      local_6e8._16_8_ = *psVar23;
      local_6e8._24_8_ = plVar16[3];
      local_6e8._0_8_ = local_6e8 + 0x10;
    }
    else {
      local_6e8._16_8_ = *psVar23;
      local_6e8._0_8_ = (size_type *)*plVar16;
    }
    local_6e8._8_8_ = plVar16[1];
    *plVar16 = (long)psVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    errorInCaffeProto((string *)local_6e8,(local_6a0->name_).ptr_,(local_6a0->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    if ((char **)local_5e8._0_8_ != &local_5d8) {
      operator_delete((void *)local_5e8._0_8_,(ulong)(local_5d8 + 1));
    }
    if ((char **)local_620._0_8_ != &local_610) {
      operator_delete((void *)local_620._0_8_,(ulong)(local_610 + 1));
    }
    pTVar12 = local_6a0;
    if ((int **)local_590._0_8_ != &local_580) {
      operator_delete((void *)local_590._0_8_,(long)local_580 + 1);
    }
    local_2f8[0] = local_508;
    ppcVar35 = (char **)local_518._0_8_;
    if ((char **)local_518._0_8_ != &local_508) {
LAB_003fbcf5:
      operator_delete(ppcVar35,(ulong)(local_2f8[0] + 1));
    }
  }
LAB_003fbcfd:
  bVar7 = (int)local_628 < 1;
  if (local_3c0 != false) {
    bVar7 = (int)local_628 != 0;
  }
  if (!bVar7) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"\'bias_term\' flag and blob size for bias incompatible","");
    errorInCaffeProto((string *)local_6e8,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if (local_3c4 != 1) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"axis","");
    uVar27 = -local_3c4;
    if (0 < (int)local_3c4) {
      uVar27 = local_3c4;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fbdfb;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fbdfb;
        }
        if (uVar21 < 10000) goto LAB_003fbdfb;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fbdfb:
    psVar4 = (pTVar12->name_).ptr_;
    psVar5 = (pTVar12->type_).ptr_;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_698,(char)uVar28 - (char)((int)local_3c4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_698._0_8_ + (ulong)(local_3c4 >> 0x1f)),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_6e8,psVar4,psVar5,(string *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    pTVar12 = local_6a0;
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if (2 < (int)local_428) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"Number of kernel size values","");
    uVar27 = -local_428;
    if (0 < (int)local_428) {
      uVar27 = local_428;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fbf1e;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fbf1e;
        }
        if (uVar21 < 10000) goto LAB_003fbf1e;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fbf1e:
    psVar4 = (pTVar12->name_).ptr_;
    psVar5 = (pTVar12->type_).ptr_;
    uVar39 = local_428 >> 0x1f;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_698,(char)uVar28 - (char)((int)local_428 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_698._0_8_ + (ulong)uVar39),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_6e8,psVar4,psVar5,(string *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    pTVar12 = local_6a0;
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if (2 < (int)local_450._24_4_) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"Number of pad values","");
    uVar27 = -local_450._24_4_;
    if (0 < (int)local_450._24_4_) {
      uVar27 = local_450._24_4_;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fc041;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fc041;
        }
        if (uVar21 < 10000) goto LAB_003fc041;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fc041:
    psVar4 = (pTVar12->name_).ptr_;
    psVar5 = (pTVar12->type_).ptr_;
    uVar39 = (uint)local_450._24_4_ >> 0x1f;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_698,(char)uVar28 - (SUB41(local_450._24_4_,3) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_698._0_8_ + (ulong)uVar39),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_6e8,psVar4,psVar5,(string *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    pTVar12 = local_6a0;
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if (2 < (int)local_418) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"Number of stride values","");
    uVar27 = -local_418;
    if (0 < (int)local_418) {
      uVar27 = local_418;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fc164;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fc164;
        }
        if (uVar21 < 10000) goto LAB_003fc164;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fc164:
    psVar4 = (pTVar12->name_).ptr_;
    psVar5 = (pTVar12->type_).ptr_;
    uVar39 = local_418 >> 0x1f;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_698,(char)uVar28 - (char)((int)local_418 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_698._0_8_ + (ulong)uVar39),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_6e8,psVar4,psVar5,(string *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    pTVar12 = local_6a0;
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  if (2 < (int)local_408) {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6e8,"Number of dilation size values","");
    uVar27 = -local_408;
    if (0 < (int)local_408) {
      uVar27 = local_408;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fc287;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fc287;
        }
        if (uVar21 < 10000) goto LAB_003fc287;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fc287:
    psVar4 = (pTVar12->name_).ptr_;
    psVar5 = (pTVar12->type_).ptr_;
    uVar39 = local_408 >> 0x1f;
    local_698._0_8_ = local_698 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_698,(char)uVar28 - (char)((int)local_408 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_698._0_8_ + (ulong)uVar39),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_6e8,psVar4,psVar5,(string *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    pTVar12 = local_6a0;
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
  }
  iVar9 = std::__cxx11::string::compare((char *)(pTVar12->type_).ptr_);
  pCVar13->isdeconvolution_ = iVar9 == 0;
  pCVar13->hasbias_ = local_3c0;
  pCVar13->ngroups_ = local_658;
  pRVar1 = &pCVar13->stride_;
  if ((pCVar13->stride_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,2);
    lVar29 = (long)pRVar1->current_size_;
    if (lVar29 != 2) {
      memset(((pCVar13->stride_).rep_)->elements + lVar29,0,lVar29 * -8 + 0x10);
    }
  }
  pRVar1->current_size_ = 2;
  if (local_418 == 0) {
    if (local_3d4 == 0) {
      uVar27 = 1;
      uVar28 = 1;
    }
    else {
      uVar28 = local_3d0 + (local_3d0 == 0);
      uVar27 = local_3d4;
      if (local_3d0 == 0) {
        uVar27 = 1;
      }
    }
  }
  else {
    if ((int)local_418 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_1f0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
    }
    uVar27 = local_410->elements[0];
    uVar28 = uVar27;
    if (local_418 != 1) {
      if ((int)local_418 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
      }
      uVar28 = *(uint *)&local_410->field_0xc;
    }
  }
  if (pRVar1->current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  ((pCVar13->stride_).rep_)->elements[0] = (ulong)uVar27;
  if ((pCVar13->stride_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  (pCVar13->stride_).rep_[1].arena = (Arena *)(ulong)uVar28;
  pRVar1 = &pCVar13->kernelsize_;
  if ((pCVar13->kernelsize_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,2);
    lVar29 = (long)pRVar1->current_size_;
    if (lVar29 != 2) {
      memset(((pCVar13->kernelsize_).rep_)->elements + lVar29,0,lVar29 * -8 + 0x10);
    }
  }
  pRVar1->current_size_ = 2;
  if (local_428 == 0) {
    uVar27 = local_3dc;
    uVar28 = local_3d8;
    if (local_3d8 == 0 || local_3dc == 0) {
      local_6e8._0_8_ = local_6e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6e8,"Kernel size cannot be 0","");
      errorInCaffeProto((string *)local_6e8,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
      if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
        operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
      }
      uVar27 = 3;
      uVar28 = 3;
    }
  }
  else {
    if ((int)local_428 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    uVar27 = local_420->elements[0];
    uVar28 = uVar27;
    if (local_428 != 1) {
      if ((int)local_428 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_d8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
      }
      uVar28 = *(uint *)&local_420->field_0xc;
    }
  }
  if (pRVar1->current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  ((pCVar13->kernelsize_).rep_)->elements[0] = (ulong)uVar27;
  if ((pCVar13->kernelsize_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  pAVar37 = (Arena *)(ulong)uVar28;
  (pCVar13->kernelsize_).rep_[1].arena = pAVar37;
  uVar28 = local_3e4;
  uVar39 = local_3e0;
  if (local_450._24_4_ != 0) {
    if ((int)local_450._24_4_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_4c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_4c0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_4c0);
    }
    uVar28 = local_430->elements[0];
    uVar39 = uVar28;
    if (local_450._24_4_ != 1) {
      if ((int)local_450._24_4_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_488,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_488,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_488);
      }
      uVar39 = *(uint *)&local_430->field_0xc;
    }
  }
  if (uVar39 == 0 && uVar28 == 0) {
    if (pCVar13->_oneof_case_[0] != 0x32) {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar13);
      pCVar13->_oneof_case_[0] = 0x32;
      pVVar17 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar17);
      (pCVar13->ConvolutionPaddingType_).valid_ = pVVar17;
    }
  }
  else {
    if (pCVar13->_oneof_case_[0] != 0x32) {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar13);
      pCVar13->_oneof_case_[0] = 0x32;
      pVVar17 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar17);
      (pCVar13->ConvolutionPaddingType_).valid_ = pVVar17;
    }
    pVVar17 = (pCVar13->ConvolutionPaddingType_).valid_;
    if (pVVar17->paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar18 = (BorderAmounts *)operator_new(0x30);
      CoreML::Specification::BorderAmounts::BorderAmounts(pBVar18);
      pVVar17->paddingamounts_ = pBVar18;
    }
    pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                        (&(pVVar17->paddingamounts_->borderamounts_).super_RepeatedPtrFieldBase,
                         (Type *)0x0);
    pTVar19->startedgesize_ = (ulong)uVar28;
    pTVar19->endedgesize_ = (ulong)uVar28;
    if (pCVar13->_oneof_case_[0] != 0x32) {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar13);
      pCVar13->_oneof_case_[0] = 0x32;
      pVVar17 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar17);
      (pCVar13->ConvolutionPaddingType_).valid_ = pVVar17;
    }
    pVVar17 = (pCVar13->ConvolutionPaddingType_).valid_;
    if (pVVar17->paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar18 = (BorderAmounts *)operator_new(0x30);
      CoreML::Specification::BorderAmounts::BorderAmounts(pBVar18);
      pVVar17->paddingamounts_ = pBVar18;
    }
    pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                        (&(pVVar17->paddingamounts_->borderamounts_).super_RepeatedPtrFieldBase,
                         (Type *)0x0);
    pTVar19->startedgesize_ = (ulong)uVar39;
    pTVar19->endedgesize_ = (ulong)uVar39;
  }
  pRVar1 = &pCVar13->dilationfactor_;
  if ((pCVar13->dilationfactor_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,2);
    lVar29 = (long)pRVar1->current_size_;
    if (lVar29 != 2) {
      memset(((pCVar13->dilationfactor_).rep_)->elements + lVar29,0,lVar29 * -8 + 0x10);
    }
  }
  pRVar1->current_size_ = 2;
  if (local_408 == 0) {
    uVar28 = 1;
    uVar39 = 1;
  }
  else {
    if ((int)local_408 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_308,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_308,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_308);
    }
    uVar28 = local_400->elements[0];
    uVar39 = uVar28;
    if (local_408 != 1) {
      if ((int)local_408 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_5e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_5e8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_5e8);
      }
      uVar39 = *(uint *)&local_400->field_0xc;
    }
  }
  if (pRVar1->current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_518,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_518,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_518);
  }
  ((pCVar13->dilationfactor_).rep_)->elements[0] = (ulong)uVar28;
  if ((pCVar13->dilationfactor_).current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_590,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_590,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_590);
  }
  (pCVar13->dilationfactor_).rep_[1].arena = (Arena *)(ulong)uVar39;
  pCVar13->outputchannels_ = local_6a8;
  if ((long)local_630 < 0) {
    __assert_fail("kernelChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xe5,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pCVar13->kernelchannels_ = local_630;
  if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_620,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_620,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_620);
  }
  uVar28 = *(uint *)((long)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18
                    );
  if ((long)(int)uVar28 < 0) {
    __assert_fail("caffeBlobSizeWeights >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xeb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  local_660 = local_660 * local_630 * (ulong)uVar27;
  uVar30 = local_660 * (long)pAVar37;
  if (uVar30 - (long)(int)uVar28 != 0) {
    cVar34 = '\x01';
    if (9 < uVar30) {
      uVar24 = uVar30;
      cVar8 = '\x04';
      do {
        cVar34 = cVar8;
        if (uVar24 < 100) {
          cVar34 = cVar34 + -2;
          goto LAB_003fcd4e;
        }
        if (uVar24 < 1000) {
          cVar34 = cVar34 + -1;
          goto LAB_003fcd4e;
        }
        if (uVar24 < 10000) goto LAB_003fcd4e;
        bVar7 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        cVar8 = cVar34 + '\x04';
      } while (bVar7);
      cVar34 = cVar34 + '\x01';
    }
LAB_003fcd4e:
    local_538 = &local_528;
    std::__cxx11::string::_M_construct((ulong)&local_538,cVar34);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_538,(uint)local_530,uVar30);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,0x5fe537);
    local_5b0 = &local_5a0;
    puVar25 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar25) {
      local_5a0 = *puVar25;
      lStack_598 = plVar16[3];
    }
    else {
      local_5a0 = *puVar25;
      local_5b0 = (ulong *)*plVar16;
    }
    local_5a8 = plVar16[1];
    *plVar16 = (long)puVar25;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_5b0);
    puVar25 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar25) {
      local_640 = *puVar25;
      uStack_638 = puVar15[3];
      local_650 = &local_640;
    }
    else {
      local_640 = *puVar25;
      local_650 = (ulong *)*puVar15;
    }
    local_648 = puVar15[1];
    *puVar15 = puVar25;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    uVar27 = 1;
    if (9 < uVar28) {
      uVar39 = uVar28;
      uVar21 = 4;
      do {
        uVar27 = uVar21;
        if (uVar39 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_003fce9d;
        }
        if (uVar39 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_003fce9d;
        }
        if (uVar39 < 10000) goto LAB_003fce9d;
        bVar7 = 99999 < uVar39;
        uVar39 = uVar39 / 10000;
        uVar21 = uVar27 + 4;
      } while (bVar7);
      uVar27 = uVar27 + 1;
    }
LAB_003fce9d:
    local_558 = local_548;
    std::__cxx11::string::_M_construct((ulong)&local_558,(char)uVar27);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_558,uVar27,uVar28);
    uVar24 = CONCAT44(uStack_54c,local_550) + local_648;
    uVar33 = 0xf;
    if (local_650 != &local_640) {
      uVar33 = local_640;
    }
    if (uVar33 < uVar24) {
      uVar33 = 0xf;
      if (local_558 != local_548) {
        uVar33 = local_548[0];
      }
      if (uVar33 < uVar24) goto LAB_003fcf1e;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_650);
    }
    else {
LAB_003fcf1e:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_650,(ulong)local_558);
    }
    local_698._0_8_ = local_698 + 0x10;
    psVar23 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar23) {
      local_698._16_8_ = *psVar23;
      local_698._24_8_ = puVar15[3];
    }
    else {
      local_698._16_8_ = *psVar23;
      local_698._0_8_ = (size_type *)*puVar15;
    }
    local_698._8_8_ = puVar15[1];
    *puVar15 = psVar23;
    puVar15[1] = 0;
    *(undefined1 *)psVar23 = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_698);
    psVar23 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar23) {
      local_6e8._16_8_ = *psVar23;
      local_6e8._24_8_ = plVar16[3];
      local_6e8._0_8_ = local_6e8 + 0x10;
    }
    else {
      local_6e8._16_8_ = *psVar23;
      local_6e8._0_8_ = (size_type *)*plVar16;
    }
    local_6e8._8_8_ = plVar16[1];
    *plVar16 = (long)psVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    errorInCaffeProto((string *)local_6e8,(local_6a0->name_).ptr_,(local_6a0->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
    if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
      operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
    if (local_650 != &local_640) {
      operator_delete(local_650,local_640 + 1);
    }
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0,local_5a0 + 1);
    }
    if (local_538 != &local_528) {
      operator_delete(local_538,local_528 + 1);
    }
  }
  if (pCVar13->weights_ == (WeightParams *)0x0) {
    pWVar20 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar20);
    pCVar13->weights_ = pWVar20;
  }
  if (uVar30 >> 0x1f != 0) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xf0,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pWVar20 = pCVar13->weights_;
  pRVar2 = &pWVar20->floatvalue_;
  iVar9 = (int)uVar30;
  if (pRVar2->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,iVar9);
    iVar10 = pRVar2->current_size_;
    if (iVar10 != iVar9) {
      memset(((pWVar20->floatvalue_).rep_)->elements + iVar10,0,
             local_660 * (long)pAVar37 * 4 + (long)iVar10 * -4);
    }
  }
  pRVar2->current_size_ = iVar9;
  if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_698,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_698,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_6e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_698);
  }
  pvVar6 = ((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar6 + 0x18) != pRVar2) {
    pRVar2->current_size_ = 0;
    iVar9 = *(int *)((long)pvVar6 + 0x18);
    if (iVar9 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,iVar9);
      memcpy(((pWVar20->floatvalue_).rep_)->elements + (pWVar20->floatvalue_).current_size_,
             (void *)(*(long *)((long)pvVar6 + 0x20) + 8),(long)*(int *)((long)pvVar6 + 0x18) << 2);
      (pWVar20->floatvalue_).current_size_ =
           (pWVar20->floatvalue_).current_size_ + *(int *)((long)pvVar6 + 0x18);
    }
  }
  if (local_3c0 == false) goto LAB_003fd720;
  if ((uint)local_628 != (uint)local_6a8) {
    cVar34 = '\x01';
    if (9 < (uint)local_6a8) {
      uVar31 = local_6a8;
      cVar8 = '\x04';
      do {
        cVar34 = cVar8;
        uVar27 = (uint)uVar31;
        if (uVar27 < 100) {
          cVar34 = cVar34 + -2;
          goto LAB_003fd258;
        }
        if (uVar27 < 1000) {
          cVar34 = cVar34 + -1;
          goto LAB_003fd258;
        }
        if (uVar27 < 10000) goto LAB_003fd258;
        uVar31 = (uVar31 & 0xffffffff) / 10000;
        cVar8 = cVar34 + '\x04';
      } while (99999 < uVar27);
      cVar34 = cVar34 + '\x01';
    }
LAB_003fd258:
    local_558 = local_548;
    std::__cxx11::string::_M_construct((ulong)&local_558,cVar34);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_558,local_550,(uint)local_6a8);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,0x5fe537);
    local_538 = &local_528;
    plVar26 = plVar16 + 2;
    if ((long *)*plVar16 == plVar26) {
      local_528 = *plVar26;
      lStack_520 = plVar16[3];
    }
    else {
      local_528 = *plVar26;
      local_538 = (long *)*plVar16;
    }
    local_530 = plVar16[1];
    *plVar16 = (long)plVar26;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_538);
    puVar25 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar25) {
      local_5a0 = *puVar25;
      lStack_598 = plVar16[3];
      local_5b0 = &local_5a0;
    }
    else {
      local_5a0 = *puVar25;
      local_5b0 = (ulong *)*plVar16;
    }
    local_5a8 = plVar16[1];
    *plVar16 = (long)puVar25;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    uVar28 = (uint)local_628;
    uVar27 = -uVar28;
    if (0 < (int)uVar28) {
      uVar27 = uVar28;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar30 = (ulong)uVar27;
      uVar39 = 4;
      do {
        uVar28 = uVar39;
        uVar21 = (uint)uVar30;
        if (uVar21 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003fd3b8;
        }
        if (uVar21 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003fd3b8;
        }
        if (uVar21 < 10000) goto LAB_003fd3b8;
        uVar30 = uVar30 / 10000;
        uVar39 = uVar28 + 4;
      } while (99999 < uVar21);
      uVar28 = uVar28 + 1;
    }
LAB_003fd3b8:
    uVar30 = local_628 >> 0x1f;
    local_4e0 = local_4d0;
    std::__cxx11::string::_M_construct
              ((ulong)&local_4e0,(char)uVar28 - ((char)(local_628 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((uVar30 & 1) + (long)local_4e0),uVar28,uVar27);
    uVar30 = 0xf;
    if (local_5b0 != &local_5a0) {
      uVar30 = local_5a0;
    }
    if (uVar30 < (ulong)(local_4d8 + local_5a8)) {
      uVar30 = 0xf;
      if (local_4e0 != local_4d0) {
        uVar30 = local_4d0[0];
      }
      if (uVar30 < (ulong)(local_4d8 + local_5a8)) goto LAB_003fd449;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_5b0);
    }
    else {
LAB_003fd449:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_4e0);
    }
    local_650 = &local_640;
    puVar25 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar25) {
      local_640 = *puVar25;
      uStack_638 = puVar15[3];
    }
    else {
      local_640 = *puVar25;
      local_650 = (ulong *)*puVar15;
    }
    local_648 = puVar15[1];
    *puVar15 = puVar25;
    puVar15[1] = 0;
    *(undefined1 *)puVar25 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_650);
    psVar23 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar23) {
      local_6e8._16_8_ = *psVar23;
      local_6e8._24_8_ = plVar16[3];
      local_6e8._0_8_ = local_6e8 + 0x10;
    }
    else {
      local_6e8._16_8_ = *psVar23;
      local_6e8._0_8_ = (size_type *)*plVar16;
    }
    local_6e8._8_8_ = plVar16[1];
    *plVar16 = (long)psVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    errorInCaffeProto((string *)local_6e8,(local_6a0->name_).ptr_,(local_6a0->type_).ptr_);
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
    }
    if (local_650 != &local_640) {
      operator_delete(local_650,local_640 + 1);
    }
    if (local_4e0 != local_4d0) {
      operator_delete(local_4e0,local_4d0[0] + 1);
    }
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0,local_5a0 + 1);
    }
    if (local_538 != &local_528) {
      operator_delete(local_538,local_528 + 1);
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
  }
  if (pCVar13->bias_ == (WeightParams *)0x0) {
    pWVar20 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar20);
    pCVar13->bias_ = pWVar20;
  }
  uVar31 = local_6a8;
  iVar9 = (int)local_6a8;
  if (iVar9 < 0) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xfb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pWVar20 = pCVar13->bias_;
  pRVar2 = &pWVar20->floatvalue_;
  if (pRVar2->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,iVar9);
    iVar10 = pRVar2->current_size_;
    if (iVar10 != iVar9) {
      memset(((pWVar20->floatvalue_).rep_)->elements + iVar10,0,uVar31 * 4 + (long)iVar10 * -4);
    }
  }
  pRVar2->current_size_ = iVar9;
  if ((local_6b0->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_6e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_6e8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_650,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_6e8);
  }
  lVar29 = *(long *)((local_6b0->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar29 + 0x18) != pRVar2) {
    pRVar2->current_size_ = 0;
    iVar9 = *(int *)(lVar29 + 0x18);
    if (iVar9 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,iVar9);
      memcpy(((pWVar20->floatvalue_).rep_)->elements + (pWVar20->floatvalue_).current_size_,
             (void *)(*(long *)(lVar29 + 0x20) + 8),(long)*(int *)(lVar29 + 0x18) << 2);
      (pWVar20->floatvalue_).current_size_ =
           (pWVar20->floatvalue_).current_size_ + *(int *)(lVar29 + 0x18);
    }
  }
LAB_003fd720:
  caffe::ConvolutionParameter::~ConvolutionParameter((ConvolutionParameter *)local_450);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    caffe::ConvolutionParameter caffeLayerParams = caffeLayer.convolution_param();
    Specification::ConvolutionLayerParams* specLayerParams = specLayer->mutable_convolution();

    // weights shape for coreml and caffe:
    // convolution ==> [outputChannels, kernelChannels, kernelHeight, kernelWidth] == [outputChannelsWeight, kernelChannels, kernelHeight, kernelWidth]
    // deconvoltuion ==> [kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth] == [kernelChannels, outputChannelsWeight, kernelHeight, kernelWidth]
    uint32_t outputChannels = caffeLayerParams.num_output();
    int64_t outputChannelsWeight = 0;
    int64_t kernelChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), caffeLayer.type());
    }
    
    //check that groups are not 0
    uint32_t numberGroups = caffeLayerParams.group();
    if (numberGroups==0) {
        CoreMLConverter::errorInCaffeProto("group parameter cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    
    if (caffeLayerWeights.blobs_size() == 2 || caffeLayerWeights.blobs_size() == 1){
        
        // Sometimes caffe models do not populate the shape (infering from other parameters)
        if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
            outputChannelsWeight = caffeLayerWeights.blobs(0).num();
            kernelChannels = caffeLayerWeights.blobs(0).channels();
        } else {
            if (caffeLayer.type() == "Deconvolution") {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(1);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(0);
            } else {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(0);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(1);
            }
        }
    } else {
        CoreMLConverter::errorInCaffeProto("Number of blobs must be 2 or 1 (when there is no bias)", caffeLayer.name(), caffeLayer.type());
    }
    
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayer.type() == "Deconvolution") {
        if (outputChannels!= outputChannelsWeight * numberGroups){
            CoreMLConverter::errorInCaffeProto(
                                               "'num_output' ("+std::to_string(outputChannels)+") divided by groups (" + std::to_string(numberGroups) + "does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    } else {
        if (outputChannels!= outputChannelsWeight){
            CoreMLConverter::errorInCaffeProto(
                    "'num_output' ("+std::to_string(outputChannels)+") does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                            ,caffeLayer.name(), caffeLayer.type());
        }
        if (outputChannels % numberGroups != 0){
            CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(outputChannels)+") must be divisible by 'groups' (" + std::to_string(numberGroups) + ")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.kernel_size_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of kernel size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.kernel_size_size()));
    }
    if (caffeLayerParams.pad_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of pad values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.pad_size()));
    }
    if (caffeLayerParams.stride_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of stride values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.stride_size()));
    }
    
    if (caffeLayerParams.dilation_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of dilation size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.dilation_size()));
    }
    //**************************************************************
    
    if (caffeLayer.type() == "Deconvolution"){
        specLayerParams->set_isdeconvolution(true);
    } else {
        specLayerParams->set_isdeconvolution(false);
    }
    specLayerParams->set_hasbias(hasBias);
    assert(numberGroups >= 0);
    specLayerParams->set_ngroups(static_cast<uint64_t>(numberGroups));
    
    //Set Stride
    ::google::protobuf::RepeatedField<uint64_t>* stride = specLayerParams->mutable_stride();
    stride->Resize(2, 0);
    uint32_t heightStride, widthStride;
    heightStride = widthStride = 1;
    if (caffeLayerParams.stride_size() != 0) {
        heightStride = caffeLayerParams.stride(0);
        if (caffeLayerParams.stride_size() == 1){
            widthStride = heightStride;
        } else {
            widthStride = caffeLayerParams.stride(1);
        }
    } else if (caffeLayerParams.stride_h() != 0 && caffeLayerParams.stride_w() != 0) {
        heightStride = caffeLayerParams.stride_h();
        widthStride = caffeLayerParams.stride_w();
    }
    specLayerParams->set_stride(0, static_cast<uint64_t>(heightStride));
    specLayerParams->set_stride(1, static_cast<uint64_t>(widthStride));
    
    //Set Kernel sizes
    ::google::protobuf::RepeatedField<uint64_t>* kernelSize = specLayerParams->mutable_kernelsize();
    kernelSize->Resize(2, 0);
    uint32_t Kh, Kw;
    Kh = Kw = 3;
    if (caffeLayerParams.kernel_size_size() != 0) {
        Kh = caffeLayerParams.kernel_size(0);
        if (caffeLayerParams.kernel_size_size() == 1){
            Kw = Kh;
        } else {
            Kw = caffeLayerParams.kernel_size(1);
        }
    } else if (caffeLayerParams.kernel_h() != 0 && caffeLayerParams.kernel_w() != 0) {
        Kh = caffeLayerParams.kernel_h();
        Kw = caffeLayerParams.kernel_w();
    } else {
        CoreMLConverter::errorInCaffeProto("Kernel size cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    specLayerParams->set_kernelsize(0, static_cast<uint64_t>(Kh));
    specLayerParams->set_kernelsize(1, static_cast<uint64_t>(Kw));
    
    //Set padding params
    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.pad_size() != 0) {
        pad_h = caffeLayerParams.pad(0);
        if (caffeLayerParams.pad_size()==1){
            pad_w = pad_h;
        } else {
            pad_w = caffeLayerParams.pad(1);
        }
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    if (pad_w==0 && pad_h==0){
        (void) specLayerParams->mutable_valid();
    } else {
        auto heightBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        heightBorder->set_startedgesize(static_cast<uint64_t>(pad_h));
        heightBorder->set_endedgesize(static_cast<uint64_t>(pad_h));
        auto widthBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        widthBorder->set_startedgesize(static_cast<uint64_t>(pad_w));
        widthBorder->set_endedgesize(static_cast<uint64_t>(pad_w));
    }
    
    //Set dilation params
    ::google::protobuf::RepeatedField<uint64_t>* dilation = specLayerParams->mutable_dilationfactor();
    dilation->Resize(2, 0);
    uint32_t heightDilation, widthDilation;
    heightDilation = widthDilation = 1;
    if (caffeLayerParams.dilation_size() != 0) {
        heightDilation = caffeLayerParams.dilation(0);
        if (caffeLayerParams.dilation_size() == 1){
            widthDilation = heightDilation;
        } else {
            widthDilation = caffeLayerParams.dilation(1);
        }
    }
    specLayerParams->set_dilationfactor(0, static_cast<uint64_t>(heightDilation));
    specLayerParams->set_dilationfactor(1, static_cast<uint64_t>(widthDilation));
    
    // Write weights
    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    assert(kernelChannels >= 0);
    specLayerParams->set_kernelchannels(static_cast<uint64_t>(kernelChannels));
    
    uint64_t blobSize = static_cast<uint64_t>(outputChannelsWeight) * static_cast<uint64_t>(kernelChannels) * static_cast<uint64_t>(Kh) * static_cast<uint64_t>(Kw);
    
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    assert(caffeBlobSizeWeights >= 0);
    if (static_cast<uint64_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string     (caffeBlobSizeWeights)+" in caffe", caffeLayer.name(), caffeLayer.type());
    }
    ::google::protobuf::RepeatedField<float>* weights = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weights->Resize(static_cast<int32_t>(blobSize), 0.0);
    weights->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength != static_cast<int32_t>(outputChannels)) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                              , caffeLayer.name(), caffeLayer.type());
        }
        ::google::protobuf::RepeatedField<float>* bias = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        bias->Resize(static_cast<int32_t>(outputChannels), 0.0);
        bias->CopyFrom(caffeLayerWeights.blobs(1).data());
    }
}